

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_1.cpp
# Opt level: O3

int cmp(void *param_1,void *param_2)

{
  bool bVar1;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double in_XMM1_Qa;
  
  dVar2 = round(in_XMM0_Qa);
  dVar3 = round(in_XMM1_Qa);
  bVar1 = in_XMM0_Qa < in_XMM1_Qa;
  if (1e-06 <= ABS(ABS(in_XMM0_Qa - dVar2) - ABS(in_XMM1_Qa - dVar3))) {
    bVar1 = ABS(in_XMM0_Qa - dVar2) < ABS(in_XMM1_Qa - dVar3);
  }
  return (uint)bVar1;
}

Assistant:

bool cmp(double a, double b)
{
    double da = fabs((a-round(a)));
    double db = fabs((b-round(b)));
    if(fabs(da-db) < EPSILON)
    {
        return a < b;
    } else
    {
        return da < db;
    }
}